

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O3

void __thiscall
VectorSUnitTest_assign_function_Test::~VectorSUnitTest_assign_function_Test
          (VectorSUnitTest_assign_function_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(VectorSUnitTest, assign_function)
{
    vector_s<std::string, 10> vsv;
    vsv.assign(5, "value");
    EXPECT_FALSE(vsv.empty());
    EXPECT_EQ(5u, vsv.size());
    EXPECT_EQ(std::string("value"), vsv[0]);
    EXPECT_EQ(std::string("value"), vsv[1]);
    EXPECT_EQ(std::string("value"), vsv[2]);
    EXPECT_EQ(std::string("value"), vsv[3]);
    EXPECT_EQ(std::string("value"), vsv[4]);
}